

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_ptr.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  weak_ptr<int> weak;
  shared_ptr<int> shared;
  __weak_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  weak_ptr<int> local_60;
  weak_ptr<int> local_50;
  weak_ptr<int> local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28 [3];
  
  a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"weak_ptr<> not yet initialized.",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  local_40.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_40.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = a_Stack_70[0]._M_pi
  ;
  if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_70[0]._M_pi)->_M_weak_count = (a_Stack_70[0]._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_70[0]._M_pi)->_M_weak_count = (a_Stack_70[0]._M_pi)->_M_weak_count + 1;
    }
  }
  observe(&local_40);
  if (local_40.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_40.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_40.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_40.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_40.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_28[0]._M_pi)->_M_use_count = 1;
  (local_28[0]._M_pi)->_M_weak_count = 1;
  (local_28[0]._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00103d10
  ;
  p_Var3 = local_28[0]._M_pi + 1;
  *(undefined4 *)&local_28[0]._M_pi[1]._vptr__Sp_counted_base = 0x2a;
  local_30 = p_Var3;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_70,local_28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"weak_ptr<> initialized with shared_ptr.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  local_50.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = a_Stack_70[0]._M_pi
  ;
  if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_70[0]._M_pi)->_M_weak_count = (a_Stack_70[0]._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_70[0]._M_pi)->_M_weak_count = (a_Stack_70[0]._M_pi)->_M_weak_count + 1;
    }
  }
  local_50.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)p_Var3;
  observe(&local_50);
  if (local_50.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_50.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_50.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_50.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_50.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  if (local_28[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28[0]._M_pi);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"shared_ptr<> has been destructed due to scope exit.",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  local_60.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = a_Stack_70[0]._M_pi
  ;
  if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_70[0]._M_pi)->_M_weak_count = (a_Stack_70[0]._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_70[0]._M_pi)->_M_weak_count = (a_Stack_70[0]._M_pi)->_M_weak_count + 1;
    }
  }
  local_60.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)p_Var3;
  observe(&local_60);
  if (local_60.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_60.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_60.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_60.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_60.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(a_Stack_70[0]._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (a_Stack_70[0]._M_pi)->_M_weak_count;
      (a_Stack_70[0]._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(a_Stack_70[0]._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	std::weak_ptr<int> weak;
	std::cout << "weak_ptr<> not yet initialized." << std::endl;
	observe(weak);

	{
		auto shared = std::make_shared<int>(42);
		weak = shared;
		std::cout << "weak_ptr<> initialized with shared_ptr." << std::endl;
		observe(weak);
	}

	std::cout << "shared_ptr<> has been destructed due to scope exit." << std::endl;
	observe(weak);

	return 0;
}